

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O3

int m_check_zero_block(aec_stream *strm)

{
  int iVar1;
  internal_state *piVar2;
  code *pcVar3;
  ulong uVar4;
  
  piVar2 = strm->state;
  if ((ulong)strm->block_size != 0) {
    uVar4 = 0;
    do {
      if (piVar2->block[uVar4] != 0) {
        if (piVar2->zero_blocks == 0) {
          pcVar3 = m_select_code_option;
        }
        else {
          piVar2->block_nonzero = 1;
          pcVar3 = m_encode_zero;
        }
        goto LAB_0010300b;
      }
      uVar4 = uVar4 + 1;
    } while (strm->block_size != uVar4);
  }
  iVar1 = piVar2->zero_blocks;
  piVar2->zero_blocks = iVar1 + 1;
  if (iVar1 == 0) {
    piVar2->zero_ref = piVar2->ref;
    piVar2->zero_ref_sample = piVar2->ref_sample;
  }
  if ((piVar2->blocks_avail == 0) || ((piVar2->blocks_dispensed & 0x3f) == 0)) {
    pcVar3 = m_encode_zero;
    if (3 < iVar1) {
      piVar2->zero_blocks = -1;
    }
  }
  else {
    pcVar3 = m_get_block;
  }
LAB_0010300b:
  piVar2->mode = pcVar3;
  return (int)piVar2;
}

Assistant:

static int m_check_zero_block(struct aec_stream *strm)
{
    /**
       Check if input block is all zero.

       Aggregate consecutive zero blocks until we find !0 or reach the
       end of a segment or RSI.
    */

    struct internal_state *state = strm->state;
    uint32_t *p = state->block;

    size_t i;
    for (i = 0; i < strm->block_size; i++)
        if (p[i] != 0)
            break;

    if (i < strm->block_size) {
        if (state->zero_blocks) {
            /* The current block isn't zero but we have to emit a
             * previous zero block first. The current block will be
             * flagged and handled later.
             */
            state->block_nonzero = 1;
            state->mode = m_encode_zero;
            return M_CONTINUE;
        }
        state->mode = m_select_code_option;
        return M_CONTINUE;
    } else {
        state->zero_blocks++;
        if (state->zero_blocks == 1) {
            state->zero_ref = state->ref;
            state->zero_ref_sample = state->ref_sample;
        }
        if (state->blocks_avail == 0 || state->blocks_dispensed % 64 == 0) {
            if (state->zero_blocks > 4)
                state->zero_blocks = ROS;

            state->mode = m_encode_zero;
            return M_CONTINUE;
        }
        state->mode = m_get_block;
        return M_CONTINUE;
    }
}